

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<kj::Repeat<char>,kj::CappedArray<char,14ul>&,char_const(&)[2]>
          (StringTree *__return_storage_ptr__,kj *this,Repeat<char> *params,
          CappedArray<char,_14UL> *params_1,char (*params_2) [2])

{
  ArrayPtr<const_char> local_48;
  size_t *local_38;
  size_t local_30;
  kj local_28;
  char *local_20;
  
  local_28 = *this;
  local_20 = *(char **)(this + 8);
  local_30 = *(size_t *)params;
  local_38 = &params->count;
  local_48 = toCharSequence<char_const(&)[2]>((char (*) [2])params_1);
  StringTree::concat<kj::Repeat<char>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_28,(Repeat<char> *)&local_38,&local_48,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}